

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

vector sptk::swipe::spline(vector x,vector y)

{
  double dVar1;
  double dVar2;
  double *__ptr;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  int xSz;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector vVar12;
  
  pdVar3 = y.v;
  pdVar5 = x.v;
  xSz = x.x;
  vVar12 = makev(xSz);
  uVar6 = xSz - 1;
  __ptr = (double *)malloc((ulong)uVar6 * 8);
  *vVar12.v = -0.5;
  dVar7 = *pdVar5;
  *__ptr = ((pdVar3[1] - *pdVar3) / (pdVar5[1] - dVar7) + -2.0) * (3.0 / (pdVar5[1] - dVar7));
  for (lVar4 = 1; lVar4 < (int)uVar6; lVar4 = lVar4 + 1) {
    dVar8 = (pdVar5[lVar4] - dVar7) / ((pdVar5 + lVar4)[1] - dVar7);
    dVar9 = vVar12.v[lVar4 + -1] * dVar8 + 2.0;
    vVar12.v[lVar4] = (dVar8 + -1.0) / dVar9;
    dVar1 = pdVar3[lVar4];
    dVar7 = pdVar5[lVar4];
    dVar2 = (pdVar5 + lVar4)[1];
    auVar10._0_8_ = dVar1 - pdVar3[lVar4 + -1];
    auVar10._8_8_ = (pdVar3 + lVar4)[1] - dVar1;
    auVar11._8_8_ = dVar2 - dVar7;
    auVar11._0_8_ = dVar7 - pdVar5[lVar4 + -1];
    auVar11 = divpd(auVar10,auVar11);
    __ptr[lVar4] = (((auVar11._8_8_ - auVar11._0_8_) * 6.0) / (dVar2 - pdVar5[lVar4 + -1]) -
                   dVar8 * __ptr[lVar4 + -1]) / dVar9;
  }
  vVar12.v[(long)(int)vVar12.x + -1] =
       (__ptr[(long)xSz + -2] * -0.5 +
       (2.0 - (pdVar3[(long)y.x + -1] - pdVar3[(long)y.x + -2]) /
              (pdVar5[(int)uVar6] - pdVar5[(long)xSz + -2])) *
       (3.0 / (pdVar5[(int)uVar6] - pdVar5[(long)xSz + -2]))) /
       (vVar12.v[(long)(int)vVar12.x + -2] * 0.5 + 1.0);
  for (uVar6 = xSz - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    vVar12.v[uVar6] = vVar12.v[uVar6] * vVar12.v[(ulong)uVar6 + 1] + __ptr[uVar6];
  }
  free(__ptr);
  vVar12._4_4_ = 0;
  return vVar12;
}

Assistant:

vector spline(vector x, vector y) {
    int i, j;
    double p, qn, sig;
    vector y2 = makev(x.x);
#if 0
    double* u = malloc((unsigned) (x.x - 1) * sizeof(double));
#else
    double* u = (double*) malloc((unsigned) (x.x - 1) * sizeof(double));
#endif
    y2.v[0] = -.5; // left boundary
    u[0] = (3. / (x.v[1] - x.v[0])) * ((y.v[1] - y.v[0]) /
                                       (x.v[1] - x.v[0]) - YP1);
    for (i = 1; i < x.x - 1; i++) { // decomp loop
        sig = (x.v[i] - x.v[i - 1]) / (x.v[i + 1] - x.v[i - 1]);
        p = sig * y2.v[i - 1] + 2.;
        y2.v[i] = (sig - 1.) / p;
        u[i] = (y.v[i + 1] - y.v[i]) / (x.v[i + 1] - x.v[i]) -
               (y.v[i] - y.v[i - 1]) / (x.v[i] - x.v[i - 1]);
        u[i] = (6 * u[i] / (x.v[i + 1] - x.v[i - 1]) - sig * u[i - 1]) / p;
    }
    qn = .5; // right boundary
    y2.v[y2.x - 1] = ((3. / (x.v[x.x - 1] - x.v[x.x - 2])) * (YPN -
                      (y.v[y.x - 1] - y.v[y.x -  2]) / (x.v[x.x - 1] -
                       x.v[x.x - 2])) - qn * u[x.x - 2]) /
                       (qn * y2.v[y2.x - 2] + 1.);
    for (j = x.x - 2; j >= 0; j--) // backsubstitution loop
        y2.v[j] = y2.v[j] * y2.v[j + 1] + u[j];
    free(u);
    return(y2);
}